

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O0

int Sbd_StoPrepareSet(Sbd_Sto_t *p,int iObj,int Index)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  Sbd_Cut_t *pCut_00;
  word wVar4;
  Sbd_Cut_t *pCutTemp;
  int *pList;
  int *pCut;
  int v;
  int i;
  Vec_Int_t *vThis;
  int Index_local;
  int iObj_local;
  Sbd_Sto_t *p_local;
  
  p_00 = Vec_WecEntry(p->vCuts,iObj);
  piVar3 = Vec_IntArray(p_00);
  pList = piVar3 + 1;
  for (pCut._4_4_ = 0; pCut._4_4_ < *piVar3; pCut._4_4_ = pCut._4_4_ + 1) {
    pCut_00 = p->pCuts[Index] + pCut._4_4_;
    *(uint *)&pCut_00->field_0x14 = *(uint *)&pCut_00->field_0x14 & 0xfffffff | *pList << 0x1c;
    for (pCut._0_4_ = 1; (int)pCut <= *pList; pCut._0_4_ = (int)pCut + 1) {
      pCut_00->pLeaves[(int)pCut + -1] = pList[(int)pCut];
    }
    pCut_00->iFunc = pList[*pList + 1];
    wVar4 = Sbd_CutGetSign(pCut_00);
    pCut_00->Sign = wVar4;
    iVar1 = Sbd_CutCost(p,pCut_00);
    pCut_00->Cost = iVar1;
    iVar1 = Sbd_CutCostLev(p,pCut_00);
    pCut_00->CostLev = iVar1;
    uVar2 = Sbd_CutTreeLeaves(p,pCut_00);
    *(uint *)&pCut_00->field_0x14 = *(uint *)&pCut_00->field_0x14 & 0xfffffe00 | uVar2 & 0x1ff;
    uVar2 = Sbd_CutSlowLeaves(p,iObj,pCut_00);
    *(uint *)&pCut_00->field_0x14 =
         *(uint *)&pCut_00->field_0x14 & 0xfffc01ff | (uVar2 & 0x1ff) << 9;
    uVar2 = Sbd_CutTopLeaves(p,iObj,pCut_00);
    *(uint *)&pCut_00->field_0x14 =
         *(uint *)&pCut_00->field_0x14 & 0xf003ffff | (uVar2 & 0x3ff) << 0x12;
    pList = pList + (*pList + 2);
  }
  return *piVar3;
}

Assistant:

static inline int Sbd_StoPrepareSet( Sbd_Sto_t * p, int iObj, int Index )
{
    Vec_Int_t * vThis = Vec_WecEntry( p->vCuts, iObj );
    int i, v, * pCut, * pList = Vec_IntArray( vThis );
    Sbd_ForEachCut( pList, pCut, i )
    {
        Sbd_Cut_t * pCutTemp = &p->pCuts[Index][i];
        pCutTemp->nLeaves = pCut[0];
        for ( v = 1; v <= pCut[0]; v++ )
            pCutTemp->pLeaves[v-1] = pCut[v];
        pCutTemp->iFunc = pCut[pCut[0]+1];
        pCutTemp->Sign = Sbd_CutGetSign( pCutTemp );
        pCutTemp->Cost = Sbd_CutCost( p, pCutTemp );
        pCutTemp->CostLev = Sbd_CutCostLev( p, pCutTemp );
        pCutTemp->nTreeLeaves = Sbd_CutTreeLeaves( p, pCutTemp );
        pCutTemp->nSlowLeaves = Sbd_CutSlowLeaves( p, iObj, pCutTemp );
        pCutTemp->nTopLeaves  = Sbd_CutTopLeaves( p, iObj, pCutTemp );
    }
    return pList[0];
}